

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O2

void __thiscall Args::Arg::checkCorrectnessAfterParsing(Arg *this)

{
  int iVar1;
  BaseException *this_00;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = (*(this->super_ArgIface)._vptr_ArgIface[5])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*(this->super_ArgIface)._vptr_ArgIface[6])(this);
    if ((char)iVar1 == '\0') {
      this_00 = (BaseException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_78,"Undefined required argument \"",&local_99);
      (*(this->super_ArgIface)._vptr_ArgIface[3])(&local_98,this);
      std::operator+(&local_58,&local_78,&local_98);
      std::operator+(&local_38,&local_58,"\".");
      BaseException::BaseException(this_00,&local_38);
      __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
    }
  }
  return;
}

Assistant:

inline void
Arg::checkCorrectnessAfterParsing() const
{
	if( isRequired() && !isDefined() )
		throw BaseException( String( SL( "Undefined required argument \"" ) ) +
			name() + SL( "\"." ) );
}